

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  uint uVar1;
  ZSTD_format_e ZVar2;
  size_t sVar3;
  size_t sVar4;
  unsigned_long_long uVar5;
  uint uVar6;
  size_t err_code;
  ulong uVar7;
  byte *src_00;
  void *pvVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  void *local_78;
  ulong local_58;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5c5f,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  ZVar2 = dctx->format;
  if (ZVar2 < 2) {
    bVar11 = false;
    local_78 = dst;
    local_58 = dstCapacity;
    do {
      while( true ) {
        if (srcSize < (ulong)(ZVar2 == ZSTD_f_zstd1) * 4 + 1) {
          if (srcSize == 0) {
            return (long)local_78 - (long)dst;
          }
          return 0xffffffffffffffb8;
        }
        if ((*src & 0xfffffff0) != 0x184d2a50) break;
        if (srcSize < 8) {
          return 0xffffffffffffffb8;
        }
        if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
          return 0xfffffffffffffff2;
        }
        uVar7 = (ulong)*(uint *)((long)src + 4) + 8;
        if (srcSize < uVar7) {
          uVar7 = 0xffffffffffffffb8;
        }
        if (0xffffffffffffff88 < uVar7) {
          return uVar7;
        }
        bVar10 = srcSize < uVar7;
        srcSize = srcSize - uVar7;
        if (bVar10) {
          __assert_fail("skippableSize <= srcSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5c84,
                        "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                       );
        }
        src = (void *)((long)src + uVar7);
      }
      if (ddict == (ZSTD_DDict *)0x0) {
        sVar4 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
        if (0xffffffffffffff88 < sVar4) {
          return sVar4;
        }
      }
      else {
        ZSTD_decompressBegin_usingDDict(dctx,ddict);
      }
      pvVar8 = dctx->previousDstEnd;
      if (pvVar8 != local_78) {
        dctx->dictEnd = pvVar8;
        dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar8) + (long)local_78);
        dctx->prefixStart = local_78;
        dctx->previousDstEnd = local_78;
      }
      ZVar2 = dctx->format;
      if (srcSize < (ulong)(ZVar2 == ZSTD_f_zstd1) * 4 + 5) {
        return 0xffffffffffffffb8;
      }
      sVar3 = ZSTD_frameHeaderSize_internal(src,(ulong)(ZVar2 == ZSTD_f_zstd1) * 4 + 1,ZVar2);
      sVar4 = sVar3;
      if (0xffffffffffffff88 < sVar3) {
LAB_00167fa7:
        sVar3 = 0xffffffffffffffb8;
        if (!bVar11) {
          sVar3 = sVar4;
        }
        if ((int)sVar4 != -10) {
          return sVar4;
        }
        return sVar3;
      }
      if (srcSize < sVar3 + 3) {
        return 0xffffffffffffffb8;
      }
      sVar4 = ZSTD_decodeFrameHeader(dctx,src,sVar3);
      if (0xffffffffffffff88 < sVar4) goto LAB_00167fa7;
      src = (void *)((long)src + sVar3);
      srcSize = srcSize - sVar3;
      pvVar8 = local_78;
      do {
        if (srcSize < 3) {
          return 0xffffffffffffffb8;
        }
        uVar1 = *src;
        sVar4 = (size_t)(uint3)((uint3)*src >> 3);
        uVar6 = (ushort)((ushort)uVar1 >> 1) & 3;
        uVar7 = (ulong)uVar6;
        if ((uVar6 != 1) && (uVar7 = sVar4, uVar6 == 3)) {
          return 0xffffffffffffffec;
        }
        uVar9 = srcSize - 3;
        srcSize = uVar9 - uVar7;
        if (uVar9 < uVar7) {
          return 0xffffffffffffffb8;
        }
        src_00 = (byte *)((long)src + 3);
        if (uVar6 == 2) {
          sVar4 = ZSTD_decompressBlock_internal
                            (dctx,pvVar8,(long)local_78 + (local_58 - (long)pvVar8),src_00,uVar7,1);
          if (0xffffffffffffff88 < sVar4) goto LAB_00167fa7;
        }
        else if (uVar6 == 1) {
          if (pvVar8 == (void *)0x0) {
            if (7 < (uint3)*src) {
              return 0xffffffffffffffb6;
            }
LAB_00167e62:
            sVar4 = 0;
          }
          else {
            if ((long)local_78 + (local_58 - (long)pvVar8) < sVar4) {
              return 0xffffffffffffffba;
            }
            memset(pvVar8,(uint)*src_00,sVar4);
          }
        }
        else {
          if (pvVar8 == (void *)0x0) {
            if (uVar7 != 0) {
              return 0xffffffffffffffb6;
            }
            goto LAB_00167e62;
          }
          if ((long)local_78 + (local_58 - (long)pvVar8) < uVar7) {
            return 0xffffffffffffffba;
          }
          memcpy(pvVar8,src_00,uVar7);
          sVar4 = uVar7;
        }
        if ((dctx->fParams).checksumFlag != 0) {
          ZSTD_XXH64_update(&dctx->xxhState,pvVar8,sVar4);
        }
        pvVar8 = (void *)((long)pvVar8 + sVar4);
        src = src_00 + uVar7;
      } while (((ushort)uVar1 & 1) == 0);
      uVar5 = (dctx->fParams).frameContentSize;
      sVar4 = (long)pvVar8 - (long)local_78;
      if ((uVar5 != 0xffffffffffffffff) && (sVar4 != uVar5)) {
        return 0xffffffffffffffec;
      }
      if ((dctx->fParams).checksumFlag != 0) {
        if (srcSize < 4) {
          return 0xffffffffffffffea;
        }
        uVar5 = ZSTD_XXH64_digest(&dctx->xxhState);
        if (*src != (uint)uVar5) {
          return 0xffffffffffffffea;
        }
        src = (void *)((long)src + 4);
        srcSize = srcSize - 4;
      }
      if (0xffffffffffffff88 < sVar4) goto LAB_00167fa7;
      bVar11 = local_58 < sVar4;
      local_58 = local_58 - sVar4;
      if (bVar11) {
        __assert_fail("res <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5ca5,
                      "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                     );
      }
      local_78 = (void *)((long)local_78 + sVar4);
      ZVar2 = dctx->format;
      bVar11 = true;
    } while (ZVar2 < 2);
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5a00,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize);
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "at least one frame successfully completed, but following "
                "bytes are garbage: it's more likely to be a srcSize error, "
                "specifying more bytes than compressed size of frame(s). This "
                "error message replaces ERROR(prefix_unknown), which would be "
                "confusing, as the first header is actually correct. Note that "
                "one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic "
                "bytes. But this is _much_ less likely than a srcSize field "
                "error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (BYTE*)dst - (BYTE*)dststart;
}